

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase888::run(TestCase888 *this)

{
  undefined8 uVar1;
  bool bVar2;
  __pid_t _Var3;
  Own<capnp::_::TestInterfaceImpl> *pOVar4;
  undefined4 extraout_var;
  Server *pSVar5;
  Server **ppSVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  Promise<capnproto_test::capnp::test::TestInterface::Client> *pPVar7;
  PromiseFulfiller<capnproto_test::capnp::test::TestInterface::Client> *pPVar8;
  char *params;
  bool local_59b;
  bool local_59a;
  bool local_599;
  undefined1 local_598 [5];
  bool _kj_shouldLog_11;
  bool _kj_shouldLog_10;
  bool _kj_shouldLog_9;
  Exception local_580;
  Client local_428;
  bool local_40c;
  bool local_40b;
  bool local_40a;
  Type local_409;
  undefined1 local_408 [4];
  bool _kj_shouldLog_8;
  bool _kj_shouldLog_7;
  bool _kj_shouldLog_6;
  Type local_3f1;
  Promise<void> local_3f0;
  Type local_3d9;
  Promise<void> local_3d8;
  Type local_3c1;
  Promise<void> local_3c0;
  undefined1 *local_3b0;
  undefined1 local_3a1 [17];
  undefined1 local_390 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_test_c__:935:13),_kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>
  promise3;
  undefined1 *local_378;
  Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> local_370;
  undefined1 local_360 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_test_c__:930:13),_kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>
  promise2;
  undefined1 *local_348 [2];
  Type local_338;
  undefined1 local_328 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_test_c__:925:13),_kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>
  promise1;
  undefined1 local_310 [5];
  bool resolved3;
  bool resolved2;
  bool resolved1;
  Client errorPromise;
  PromiseFulfillerPair<capnproto_test::capnp::test::TestInterface::Client> errorPaf;
  Client clientPromise;
  PromiseFulfillerPair<capnproto_test::capnp::test::TestInterface::Client> paf;
  undefined1 local_298 [7];
  bool _kj_shouldLog_5;
  Maybe<capnproto_test::capnp::test::TestInterface::Server_&> local_288;
  bool local_279;
  undefined1 local_278 [7];
  bool _kj_shouldLog_4;
  Maybe<capnproto_test::capnp::test::TestInterface::Server_&> local_268;
  bool local_259;
  undefined1 local_258 [7];
  bool _kj_shouldLog_3;
  Maybe<capnproto_test::capnp::test::TestInterface::Server_&> local_248;
  bool local_239;
  undefined1 local_238 [7];
  bool _kj_shouldLog_2;
  Maybe<capnproto_test::capnp::test::TestInterface::Server_&> local_228;
  Server *local_220;
  Fault local_218;
  Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> local_210;
  Maybe<capnproto_test::capnp::test::TestInterface::Server_&> local_200;
  Server *local_1f8;
  Server *_kj_result_3;
  TestInterfaceImpl *local_1e8;
  bool local_1d9;
  Server *pSStack_1d8;
  bool _kj_shouldLog_1;
  Fault local_1d0;
  Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> local_1c8;
  Maybe<capnproto_test::capnp::test::TestInterface::Server_&> local_1b8;
  Server *local_1b0;
  Server *_kj_result_2;
  Fault local_1a0;
  Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> local_198;
  Maybe<capnproto_test::capnp::test::TestInterface::Server_&> local_188;
  Server *local_180;
  Server *_kj_result_1;
  TestInterfaceImpl *local_170;
  bool local_161;
  Server *pSStack_160;
  bool _kj_shouldLog;
  Fault local_158;
  Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> local_150;
  Maybe<capnproto_test::capnp::test::TestInterface::Server_&> local_140;
  Server *local_138;
  Server *_kj_result;
  undefined1 local_120 [8];
  Client client2;
  TestInterfaceImpl *server2;
  Own<capnp::_::TestInterfaceImpl> ownServer2;
  undefined1 local_e0 [8];
  Client client1;
  TestInterfaceImpl *server1;
  Own<capnp::_::TestInterfaceImpl> ownServer1;
  Client clientNull;
  undefined1 local_88 [8];
  Client clientStandalone;
  undefined1 local_66;
  undefined1 local_65;
  int callCount;
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface> set2;
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface> set1;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase888 *this_local;
  
  kj::EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  kj::WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  clientStandalone._20_4_ = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>
            ((kj *)&clientNull.field_0x10,(int *)&clientStandalone.field_0x14);
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestInterfaceImpl,void>
            ((Client *)local_88,(Own<capnp::_::TestInterfaceImpl> *)&clientNull.field_0x10);
  kj::Own<capnp::_::TestInterfaceImpl>::~Own
            ((Own<capnp::_::TestInterfaceImpl> *)&clientNull.field_0x10);
  capnproto_test::capnp::test::TestInterface::Client::Client((Client *)&ownServer1.ptr,(void *)0x0);
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&server1,(int *)&clientStandalone.field_0x14);
  client1._16_8_ =
       kj::Own<capnp::_::TestInterfaceImpl>::operator*((Own<capnp::_::TestInterfaceImpl> *)&server1)
  ;
  pOVar4 = kj::mv<kj::Own<capnp::_::TestInterfaceImpl>>
                     ((Own<capnp::_::TestInterfaceImpl> *)&server1);
  kj::Own<capnproto_test::capnp::test::TestInterface::Server>::Own<capnp::_::TestInterfaceImpl,void>
            ((Own<capnproto_test::capnp::test::TestInterface::Server> *)&ownServer2.ptr,pOVar4);
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::add
            ((Client *)local_e0,
             (CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_65,
             (Own<capnproto_test::capnp::test::TestInterface::Server> *)&ownServer2.ptr);
  kj::Own<capnproto_test::capnp::test::TestInterface::Server>::~Own
            ((Own<capnproto_test::capnp::test::TestInterface::Server> *)&ownServer2.ptr);
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&server2,(int *)&clientStandalone.field_0x14);
  client2._16_8_ =
       kj::Own<capnp::_::TestInterfaceImpl>::operator*((Own<capnp::_::TestInterfaceImpl> *)&server2)
  ;
  pOVar4 = kj::mv<kj::Own<capnp::_::TestInterfaceImpl>>
                     ((Own<capnp::_::TestInterfaceImpl> *)&server2);
  kj::Own<capnproto_test::capnp::test::TestInterface::Server>::Own<capnp::_::TestInterfaceImpl,void>
            ((Own<capnproto_test::capnp::test::TestInterface::Server> *)&_kj_result,pOVar4);
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::add
            ((Client *)local_120,
             (CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_66,
             (Own<capnproto_test::capnp::test::TestInterface::Server> *)&_kj_result);
  kj::Own<capnproto_test::capnp::test::TestInterface::Server>::~Own
            ((Own<capnproto_test::capnp::test::TestInterface::Server> *)&_kj_result);
  uVar1 = client1._16_8_;
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
            ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_150,
             (Client *)&local_65);
  _Var3 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                    (&local_150,local_58);
  local_140.ptr = (Server *)CONCAT44(extraout_var,_Var3);
  pSVar5 = kj::_::readMaybe<capnproto_test::capnp::test::TestInterface::Server>(&local_140);
  kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::~Promise
            (&local_150);
  local_138 = pSVar5;
  if (pSVar5 == (Server *)0x0) {
    kj::_::Debug::Fault::Fault
              (&local_158,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x38b,FAILED,"set1.getLocalServer(client1).wait(waitScope) != nullptr","");
    kj::_::Debug::Fault::fatal(&local_158);
  }
  ppSVar6 = kj::mv<capnproto_test::capnp::test::TestInterface::Server*>(&local_138);
  pSStack_160 = *ppSVar6;
  if ((Server *)uVar1 != pSStack_160) {
    local_161 = kj::_::Debug::shouldLog(ERROR);
    while (local_161 != false) {
      local_170 = (TestInterfaceImpl *)client1._16_8_;
      CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
                ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_198,
                 (Client *)&local_65);
      _Var3 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                        (&local_198,local_58);
      local_188.ptr = (Server *)CONCAT44(extraout_var_00,_Var3);
      pSVar5 = kj::_::readMaybe<capnproto_test::capnp::test::TestInterface::Server>(&local_188);
      kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::~Promise
                (&local_198);
      local_180 = pSVar5;
      if (pSVar5 == (Server *)0x0) {
        kj::_::Debug::Fault::Fault
                  (&local_1a0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                   ,0x38b,FAILED,"set1.getLocalServer(client1).wait(waitScope) != nullptr","");
        kj::_::Debug::Fault::fatal(&local_1a0);
      }
      ppSVar6 = kj::mv<capnproto_test::capnp::test::TestInterface::Server*>(&local_180);
      _kj_result_2 = *ppSVar6;
      _kj_result_1 = _kj_result_2;
      kj::_::Debug::
      log<char_const(&)[442],capnp::_::TestInterfaceImpl*,capnproto_test::capnp::test::TestInterface::Server*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x38b,ERROR,
                 "\"failed: expected \" \"(&server1) == (&(*({ auto _kj_result = ::kj::_::readMaybe(set1.getLocalServer(client1).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\\\", 907, ::kj::Exception::Type::FAILED, \\\"set1.getLocalServer(client1).wait(waitScope)\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", &server1, &(*({ auto _kj_result = ::kj::_::readMaybe(set1.getLocalServer(client1).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\", 907, ::kj::Exception::Type::FAILED, \"set1.getLocalServer(client1).wait(waitScope)\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
                 ,(char (*) [442])
                  "failed: expected (&server1) == (&(*({ auto _kj_result = ::kj::_::readMaybe(set1.getLocalServer(client1).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\", 907, ::kj::Exception::Type::FAILED, \"set1.getLocalServer(client1).wait(waitScope)\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
                 ,&local_170,&_kj_result_1);
      local_161 = false;
    }
  }
  uVar1 = client2._16_8_;
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
            ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_1c8,
             (Client *)&local_66);
  _Var3 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                    (&local_1c8,local_58);
  local_1b8.ptr = (Server *)CONCAT44(extraout_var_01,_Var3);
  pSVar5 = kj::_::readMaybe<capnproto_test::capnp::test::TestInterface::Server>(&local_1b8);
  kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::~Promise
            (&local_1c8);
  local_1b0 = pSVar5;
  if (pSVar5 == (Server *)0x0) {
    kj::_::Debug::Fault::Fault
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x38c,FAILED,"set2.getLocalServer(client2).wait(waitScope) != nullptr","");
    kj::_::Debug::Fault::fatal(&local_1d0);
  }
  ppSVar6 = kj::mv<capnproto_test::capnp::test::TestInterface::Server*>(&local_1b0);
  pSStack_1d8 = *ppSVar6;
  if ((Server *)uVar1 != pSStack_1d8) {
    local_1d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1d9 != false) {
      local_1e8 = (TestInterfaceImpl *)client2._16_8_;
      CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
                ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_210,
                 (Client *)&local_66);
      _Var3 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                        (&local_210,local_58);
      local_200.ptr = (Server *)CONCAT44(extraout_var_02,_Var3);
      pSVar5 = kj::_::readMaybe<capnproto_test::capnp::test::TestInterface::Server>(&local_200);
      kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::~Promise
                (&local_210);
      local_1f8 = pSVar5;
      if (pSVar5 == (Server *)0x0) {
        kj::_::Debug::Fault::Fault
                  (&local_218,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                   ,0x38c,FAILED,"set2.getLocalServer(client2).wait(waitScope) != nullptr","");
        kj::_::Debug::Fault::fatal(&local_218);
      }
      ppSVar6 = kj::mv<capnproto_test::capnp::test::TestInterface::Server*>(&local_1f8);
      local_220 = *ppSVar6;
      _kj_result_3 = local_220;
      kj::_::Debug::
      log<char_const(&)[442],capnp::_::TestInterfaceImpl*,capnproto_test::capnp::test::TestInterface::Server*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x38c,ERROR,
                 "\"failed: expected \" \"(&server2) == (&(*({ auto _kj_result = ::kj::_::readMaybe(set2.getLocalServer(client2).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\\\", 908, ::kj::Exception::Type::FAILED, \\\"set2.getLocalServer(client2).wait(waitScope)\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", &server2, &(*({ auto _kj_result = ::kj::_::readMaybe(set2.getLocalServer(client2).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\", 908, ::kj::Exception::Type::FAILED, \"set2.getLocalServer(client2).wait(waitScope)\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
                 ,(char (*) [442])
                  "failed: expected (&server2) == (&(*({ auto _kj_result = ::kj::_::readMaybe(set2.getLocalServer(client2).wait(waitScope)); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++\", 908, ::kj::Exception::Type::FAILED, \"set2.getLocalServer(client2).wait(waitScope)\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
                 ,&local_1e8,&_kj_result_3);
      local_1d9 = false;
    }
  }
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
            ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)local_238,
             (Client *)&local_65);
  _Var3 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                    ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
                     local_238,local_58);
  local_228.ptr = (Server *)CONCAT44(extraout_var_03,_Var3);
  bVar2 = kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>::operator==
                    (&local_228,(void *)0x0);
  kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::~Promise
            ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)local_238)
  ;
  if (!bVar2) {
    local_239 = kj::_::Debug::shouldLog(ERROR);
    while (local_239 != false) {
      kj::_::Debug::log<char_const(&)[73]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x38f,ERROR,
                 "\"failed: expected \" \"set1.getLocalServer(client2).wait(waitScope) == nullptr\""
                 ,(char (*) [73])
                  "failed: expected set1.getLocalServer(client2).wait(waitScope) == nullptr");
      local_239 = false;
    }
  }
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
            ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)local_258,
             (Client *)&local_66);
  _Var3 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                    ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
                     local_258,local_58);
  local_248.ptr = (Server *)CONCAT44(extraout_var_04,_Var3);
  bVar2 = kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>::operator==
                    (&local_248,(void *)0x0);
  kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::~Promise
            ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)local_258)
  ;
  if (!bVar2) {
    local_259 = kj::_::Debug::shouldLog(ERROR);
    while (local_259 != false) {
      kj::_::Debug::log<char_const(&)[73]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x390,ERROR,
                 "\"failed: expected \" \"set2.getLocalServer(client1).wait(waitScope) == nullptr\""
                 ,(char (*) [73])
                  "failed: expected set2.getLocalServer(client1).wait(waitScope) == nullptr");
      local_259 = false;
    }
  }
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
            ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)local_278,
             (Client *)&local_65);
  _Var3 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                    ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
                     local_278,local_58);
  local_268.ptr = (Server *)CONCAT44(extraout_var_05,_Var3);
  bVar2 = kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>::operator==
                    (&local_268,(void *)0x0);
  kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::~Promise
            ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)local_278)
  ;
  if (!bVar2) {
    local_279 = kj::_::Debug::shouldLog(ERROR);
    while (local_279 != false) {
      kj::_::Debug::log<char_const(&)[82]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x391,ERROR,
                 "\"failed: expected \" \"set1.getLocalServer(clientStandalone).wait(waitScope) == nullptr\""
                 ,(char (*) [82])
                  "failed: expected set1.getLocalServer(clientStandalone).wait(waitScope) == nullptr"
                );
      local_279 = false;
    }
  }
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
            ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)local_298,
             (Client *)&local_65);
  _Var3 = kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
                    ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
                     local_298,local_58);
  local_288.ptr = (Server *)CONCAT44(extraout_var_06,_Var3);
  bVar2 = kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>::operator==
                    (&local_288,(void *)0x0);
  kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::~Promise
            ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)local_298)
  ;
  if (!bVar2) {
    paf.fulfiller.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)paf.fulfiller.ptr._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[76]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x392,ERROR,
                 "\"failed: expected \" \"set1.getLocalServer(clientNull).wait(waitScope) == nullptr\""
                 ,(char (*) [76])
                  "failed: expected set1.getLocalServer(clientNull).wait(waitScope) == nullptr");
      paf.fulfiller.ptr._7_1_ = false;
    }
  }
  kj::newPromiseAndFulfiller<capnproto_test::capnp::test::TestInterface::Client>();
  pPVar7 = kj::mv<kj::Promise<capnproto_test::capnp::test::TestInterface::Client>>
                     ((Promise<capnproto_test::capnp::test::TestInterface::Client> *)
                      &clientPromise.field_0x10);
  capnproto_test::capnp::test::TestInterface::Client::
  Client<capnproto_test::capnp::test::TestInterface::Client,void>
            ((Client *)&errorPaf.fulfiller.ptr,pPVar7);
  kj::newPromiseAndFulfiller<capnproto_test::capnp::test::TestInterface::Client>();
  pPVar7 = kj::mv<kj::Promise<capnproto_test::capnp::test::TestInterface::Client>>
                     ((Promise<capnproto_test::capnp::test::TestInterface::Client> *)
                      &errorPromise.field_0x10);
  capnproto_test::capnp::test::TestInterface::Client::
  Client<capnproto_test::capnp::test::TestInterface::Client,void>((Client *)local_310,pPVar7);
  promise1.super_PromiseBase.node.ptr._7_1_ = 0;
  promise1.super_PromiseBase.node.ptr._6_1_ = 0;
  promise1.super_PromiseBase.node.ptr._5_1_ = 0;
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
            ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_338,
             (Client *)&local_65);
  local_348[0] = (undefined1 *)((long)&promise1.super_PromiseBase.node.ptr + 7);
  local_348[1] = (undefined1 *)client1._16_8_;
  kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>>::
  then<capnp::_::(anonymous_namespace)::TestCase888::run()::__0,kj::_::PropagateException>
            ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>> *)local_328,
             &local_338,(PropagateException *)local_348);
  kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::~Promise
            ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)&local_338
            );
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
            ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)&local_370,
             (Client *)&local_66);
  local_378 = (undefined1 *)((long)&promise1.super_PromiseBase.node.ptr + 6);
  kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>>::
  then<capnp::_::(anonymous_namespace)::TestCase888::run()::__1,kj::_::PropagateException>
            ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>> *)local_360,
             (Type *)&local_370,(PropagateException *)&local_378);
  kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::~Promise
            (&local_370);
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
            ((CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *)(local_3a1 + 1),
             (Client *)&local_65);
  local_3b0 = (undefined1 *)((long)&promise1.super_PromiseBase.node.ptr + 5);
  params = (char *)&local_3b0;
  kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>>::
  then<capnp::_::(anonymous_namespace)::TestCase888::run()::__2,capnp::_::(anonymous_namespace)::TestCase888::run()::__3>
            ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>> *)local_390,
             (Type *)(local_3a1 + 1),(Type *)local_3a1);
  kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::~Promise
            ((Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
             (local_3a1 + 1));
  kj::evalLater<capnp::_::(anonymous_namespace)::TestCase888::run()::__4>
            ((kj *)&local_3c0,&local_3c1);
  kj::Promise<void>::wait(&local_3c0,local_58);
  kj::Promise<void>::~Promise(&local_3c0);
  kj::evalLater<capnp::_::(anonymous_namespace)::TestCase888::run()::__5>
            ((kj *)&local_3d8,&local_3d9);
  kj::Promise<void>::wait(&local_3d8,local_58);
  kj::Promise<void>::~Promise(&local_3d8);
  kj::evalLater<capnp::_::(anonymous_namespace)::TestCase888::run()::__6>
            ((kj *)&local_3f0,&local_3f1);
  kj::Promise<void>::wait(&local_3f0,local_58);
  kj::Promise<void>::~Promise(&local_3f0);
  kj::evalLater<capnp::_::(anonymous_namespace)::TestCase888::run()::__7>
            ((kj *)local_408,&local_409);
  kj::Promise<void>::wait((Promise<void> *)local_408,local_58);
  kj::Promise<void>::~Promise((Promise<void> *)local_408);
  if ((promise1.super_PromiseBase.node.ptr._7_1_ & 1) != 0) {
    local_40a = kj::_::Debug::shouldLog(ERROR);
    while (local_40a != false) {
      params = "\"failed: expected \" \"!(resolved1)\"";
      kj::_::Debug::log<char_const(&)[30]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3b3,ERROR,"\"failed: expected \" \"!(resolved1)\"",
                 (char (*) [30])"failed: expected !(resolved1)");
      local_40a = false;
    }
  }
  if ((promise1.super_PromiseBase.node.ptr._6_1_ & 1) != 0) {
    local_40b = kj::_::Debug::shouldLog(ERROR);
    while (local_40b != false) {
      params = "\"failed: expected \" \"!(resolved2)\"";
      kj::_::Debug::log<char_const(&)[30]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3b4,ERROR,"\"failed: expected \" \"!(resolved2)\"",
                 (char (*) [30])"failed: expected !(resolved2)");
      local_40b = false;
    }
  }
  if ((promise1.super_PromiseBase.node.ptr._5_1_ & 1) != 0) {
    local_40c = kj::_::Debug::shouldLog(ERROR);
    while (local_40c != false) {
      params = "\"failed: expected \" \"!(resolved3)\"";
      kj::_::Debug::log<char_const(&)[30]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3b5,ERROR,"\"failed: expected \" \"!(resolved3)\"",
                 (char (*) [30])"failed: expected !(resolved3)");
      local_40c = false;
    }
  }
  pPVar8 = kj::Own<kj::PromiseFulfiller<capnproto_test::capnp::test::TestInterface::Client>_>::
           operator->((Own<kj::PromiseFulfiller<capnproto_test::capnp::test::TestInterface::Client>_>
                       *)&paf.promise.super_PromiseBase.node.ptr);
  kj::cp<capnproto_test::capnp::test::TestInterface::Client>(&local_428,(Client *)local_e0);
  (**pPVar8->_vptr_PromiseFulfiller)(pPVar8,&local_428);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_428);
  pPVar8 = kj::Own<kj::PromiseFulfiller<capnproto_test::capnp::test::TestInterface::Client>_>::
           operator->((Own<kj::PromiseFulfiller<capnproto_test::capnp::test::TestInterface::Client>_>
                       *)&errorPaf.promise.super_PromiseBase.node.ptr);
  kj::_::Debug::makeDescription<char_const(&)[4]>
            ((String *)local_598,(Debug *)"\"foo\"","foo",(char (*) [4])params);
  kj::Exception::Exception
            (&local_580,FAILED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
             ,0x3b8,(String *)local_598);
  (*pPVar8->_vptr_PromiseFulfiller[1])(pPVar8,&local_580);
  kj::Exception::~Exception(&local_580);
  kj::String::~String((String *)local_598);
  kj::Promise<void>::wait((Promise<void> *)local_328,local_58);
  kj::Promise<void>::wait((Promise<void> *)local_360,local_58);
  kj::Promise<void>::wait((Promise<void> *)local_390,local_58);
  if ((promise1.super_PromiseBase.node.ptr._7_1_ & 1) == 0) {
    local_599 = kj::_::Debug::shouldLog(ERROR);
    while (local_599 != false) {
      kj::_::Debug::log<char_const(&)[27]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3be,ERROR,"\"failed: expected \" \"resolved1\"",
                 (char (*) [27])"failed: expected resolved1");
      local_599 = false;
    }
  }
  if ((promise1.super_PromiseBase.node.ptr._6_1_ & 1) == 0) {
    local_59a = kj::_::Debug::shouldLog(ERROR);
    while (local_59a != false) {
      kj::_::Debug::log<char_const(&)[27]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3bf,ERROR,"\"failed: expected \" \"resolved2\"",
                 (char (*) [27])"failed: expected resolved2");
      local_59a = false;
    }
  }
  if ((promise1.super_PromiseBase.node.ptr._5_1_ & 1) == 0) {
    local_59b = kj::_::Debug::shouldLog(ERROR);
    while (local_59b != false) {
      kj::_::Debug::log<char_const(&)[27]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x3c0,ERROR,"\"failed: expected \" \"resolved3\"",
                 (char (*) [27])"failed: expected resolved3");
      local_59b = false;
    }
  }
  kj::Promise<void>::~Promise((Promise<void> *)local_390);
  kj::Promise<void>::~Promise((Promise<void> *)local_360);
  kj::Promise<void>::~Promise((Promise<void> *)local_328);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)local_310);
  kj::PromiseFulfillerPair<capnproto_test::capnp::test::TestInterface::Client>::
  ~PromiseFulfillerPair
            ((PromiseFulfillerPair<capnproto_test::capnp::test::TestInterface::Client> *)
             &errorPromise.field_0x10);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)&errorPaf.fulfiller.ptr);
  kj::PromiseFulfillerPair<capnproto_test::capnp::test::TestInterface::Client>::
  ~PromiseFulfillerPair
            ((PromiseFulfillerPair<capnproto_test::capnp::test::TestInterface::Client> *)
             &clientPromise.field_0x10);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)local_120);
  kj::Own<capnp::_::TestInterfaceImpl>::~Own((Own<capnp::_::TestInterfaceImpl> *)&server2);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)local_e0);
  kj::Own<capnp::_::TestInterfaceImpl>::~Own((Own<capnp::_::TestInterfaceImpl> *)&server1);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)&ownServer1.ptr);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)local_88);
  kj::WaitScope::~WaitScope((WaitScope *)local_58);
  kj::EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Capability, CapabilityServerSet) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  CapabilityServerSet<test::TestInterface> set1, set2;

  int callCount = 0;
  test::TestInterface::Client clientStandalone(kj::heap<TestInterfaceImpl>(callCount));
  test::TestInterface::Client clientNull = nullptr;

  auto ownServer1 = kj::heap<TestInterfaceImpl>(callCount);
  auto& server1 = *ownServer1;
  test::TestInterface::Client client1 = set1.add(kj::mv(ownServer1));

  auto ownServer2 = kj::heap<TestInterfaceImpl>(callCount);
  auto& server2 = *ownServer2;
  test::TestInterface::Client client2 = set2.add(kj::mv(ownServer2));

  // Getting the local server using the correct set works.
  EXPECT_EQ(&server1, &KJ_ASSERT_NONNULL(set1.getLocalServer(client1).wait(waitScope)));
  EXPECT_EQ(&server2, &KJ_ASSERT_NONNULL(set2.getLocalServer(client2).wait(waitScope)));

  // Getting the local server using the wrong set doesn't work.
  EXPECT_TRUE(set1.getLocalServer(client2).wait(waitScope) == nullptr);
  EXPECT_TRUE(set2.getLocalServer(client1).wait(waitScope) == nullptr);
  EXPECT_TRUE(set1.getLocalServer(clientStandalone).wait(waitScope) == nullptr);
  EXPECT_TRUE(set1.getLocalServer(clientNull).wait(waitScope) == nullptr);

  // A promise client waits to be resolved.
  auto paf = kj::newPromiseAndFulfiller<test::TestInterface::Client>();
  test::TestInterface::Client clientPromise = kj::mv(paf.promise);

  auto errorPaf = kj::newPromiseAndFulfiller<test::TestInterface::Client>();
  test::TestInterface::Client errorPromise = kj::mv(errorPaf.promise);

  bool resolved1 = false, resolved2 = false, resolved3 = false;
  auto promise1 = set1.getLocalServer(clientPromise)
      .then([&](kj::Maybe<test::TestInterface::Server&> server) {
    resolved1 = true;
    EXPECT_EQ(&server1, &KJ_ASSERT_NONNULL(server));
  });
  auto promise2 = set2.getLocalServer(clientPromise)
      .then([&](kj::Maybe<test::TestInterface::Server&> server) {
    resolved2 = true;
    EXPECT_TRUE(server == nullptr);
  });
  auto promise3 = set1.getLocalServer(errorPromise)
      .then([&](kj::Maybe<test::TestInterface::Server&> server) {
    KJ_FAIL_EXPECT("getLocalServer() on error promise should have thrown");
  }, [&](kj::Exception&& e) {
    resolved3 = true;
    KJ_EXPECT(e.getDescription().endsWith("foo"), e.getDescription());
  });

  kj::evalLater([](){}).wait(waitScope);
  kj::evalLater([](){}).wait(waitScope);
  kj::evalLater([](){}).wait(waitScope);
  kj::evalLater([](){}).wait(waitScope);

  EXPECT_FALSE(resolved1);
  EXPECT_FALSE(resolved2);
  EXPECT_FALSE(resolved3);

  paf.fulfiller->fulfill(kj::cp(client1));
  errorPaf.fulfiller->reject(KJ_EXCEPTION(FAILED, "foo"));

  promise1.wait(waitScope);
  promise2.wait(waitScope);
  promise3.wait(waitScope);

  EXPECT_TRUE(resolved1);
  EXPECT_TRUE(resolved2);
  EXPECT_TRUE(resolved3);
}